

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_receive
          (bt_peer_connection *this,error_code *error,size_t bytes_transferred)

{
  bool bVar1;
  int iVar2;
  size_t *in_RCX;
  uchar *in_R8;
  size_t in_R9;
  int local_70;
  int sub_transferred;
  undefined4 local_58;
  undefined1 local_51;
  error_code local_50;
  int local_40;
  int consumed;
  undefined1 local_30 [8];
  cork c_;
  size_t bytes_transferred_local;
  error_code *error_local;
  bt_peer_connection *this_local;
  
  c_._8_8_ = bytes_transferred;
  bVar1 = boost::system::error_code::operator_cast_to_bool(error);
  if (bVar1) {
    peer_connection::received_bytes(&this->super_peer_connection,0,c_._8_4_);
  }
  else {
    cork::cork((cork *)local_30,&this->super_peer_connection);
    bVar1 = encryption_handler::is_recv_plaintext(&this->m_enc_handler);
    if (bVar1) {
      on_receive_impl(this,c_._8_8_);
LAB_002333c2:
      local_58 = 0;
    }
    else {
      local_40 = encryption_handler::decrypt
                           (&this->m_enc_handler,(EVP_PKEY_CTX *)&this->m_recv_buffer,
                            &c_.m_need_uncork,in_RCX,in_R8,in_R9);
      if (0 < local_40 + c_._8_4_) {
        peer_connection::peer_log
                  (&this->super_peer_connection,incoming_message,"ENCRYPTION",
                   "decrypted block s = %d",(ulong)(uint)(local_40 + c_._8_4_));
      }
      if (c_._8_8_ == -1) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_50,parse_failed,(type *)0x0);
        local_51 = 0;
        (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                  (this,&local_50,0xf,0);
        local_58 = 1;
      }
      else {
        peer_connection::received_bytes(&this->super_peer_connection,0,local_40);
        bVar1 = crypto_receive_buffer::crypto_packet_finished(&this->m_recv_buffer);
        if ((bVar1) ||
           (iVar2 = crypto_receive_buffer::crypto_packet_size(&this->m_recv_buffer),
           iVar2 < 0x100401)) {
          local_70 = 0;
          do {
            bVar1 = false;
            if (c_._8_8_ != 0) {
              local_70 = crypto_receive_buffer::advance_pos(&this->m_recv_buffer,c_._8_4_);
              bVar1 = 0 < local_70;
            }
            if (!bVar1) goto LAB_002333c2;
            on_receive_impl(this,(long)local_70);
            c_._8_8_ = c_._8_8_ - (long)local_70;
          } while (((this->super_peer_connection).super_peer_connection_hot_members.field_0x28 & 1)
                   == 0);
          local_58 = 1;
        }
        else {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&sub_transferred,packet_too_large,(type *)0x0);
          (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                    (this,(error_code *)&sub_transferred,0xf,2);
          local_58 = 1;
        }
      }
    }
    cork::~cork((cork *)local_30);
  }
  return;
}

Assistant:

void bt_peer_connection::on_receive(error_code const& error
		, std::size_t bytes_transferred)
	{
		INVARIANT_CHECK;

		if (error)
		{
			received_bytes(0, int(bytes_transferred));
			return;
		}

		// make sure are much as possible of the response ends up in the same
		// packet, or at least back-to-back packets
		cork c_(*this);

#if !defined TORRENT_DISABLE_ENCRYPTION
		if (!m_enc_handler.is_recv_plaintext())
		{
			int const consumed = m_enc_handler.decrypt(m_recv_buffer, bytes_transferred);
#ifndef TORRENT_DISABLE_LOGGING
			if (consumed + int(bytes_transferred) > 0)
				peer_log(peer_log_alert::incoming_message, "ENCRYPTION"
					, "decrypted block s = %d", consumed + int(bytes_transferred));
#endif
			if (bytes_transferred == SIZE_MAX)
			{
				disconnect(errors::parse_failed, operation_t::encryption);
				return;
			}
			received_bytes(0, consumed);

			// don't accept packets larger than 1 MB with a 1KB allowance for headers
			if (!m_recv_buffer.crypto_packet_finished()
				&& m_recv_buffer.crypto_packet_size() > 1025 * 1024)
			{
				disconnect(errors::packet_too_large, operation_t::encryption, peer_error);
				return;
			}

			int sub_transferred = 0;
			while (bytes_transferred > 0 &&
				((sub_transferred = m_recv_buffer.advance_pos(int(bytes_transferred))) > 0))
			{
#if TORRENT_USE_ASSERTS
				std::int64_t const cur_payload_dl = m_statistics.last_payload_downloaded();
				std::int64_t const cur_protocol_dl = m_statistics.last_protocol_downloaded();
#endif
				TORRENT_ASSERT(sub_transferred > 0);
				on_receive_impl(std::size_t(sub_transferred));
				bytes_transferred -= std::size_t(sub_transferred);

#if TORRENT_USE_ASSERTS
				TORRENT_ASSERT(m_statistics.last_payload_downloaded() - cur_payload_dl >= 0);
				TORRENT_ASSERT(m_statistics.last_protocol_downloaded() - cur_protocol_dl >= 0);
				std::int64_t const stats_diff = m_statistics.last_payload_downloaded() - cur_payload_dl +
					m_statistics.last_protocol_downloaded() - cur_protocol_dl;
				TORRENT_ASSERT(stats_diff == sub_transferred);
#endif

				if (m_disconnecting) return;
			}
		}
		else
#endif
			on_receive_impl(bytes_transferred);
	}